

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O2

void testProcrustesWithMatrix<float>(M44d *m)

{
  double dVar1;
  double dVar2;
  ostream *poVar3;
  long lVar4;
  Rand48 random;
  Vec3<float> local_d0;
  long local_c0;
  vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> toPoints;
  vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> fromPoints;
  V3d fromPt;
  V3d toPt;
  
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "Testing Procrustes algorithm with arbitrary matrix: \n");
  Imath_2_5::operator<<(poVar3,m);
  fromPoints.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  toPoints.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fromPoints.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fromPoints.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  toPoints.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  toPoints.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  random._state[0] = 0x7c67;
  random._state[1] = 0x1005;
  random._state[2] = 0x7c67;
  std::operator<<((ostream *)&std::cout,"   numPoints: ");
  lVar4 = 1;
  while (lVar4 != 10) {
    local_c0 = lVar4;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar3," ");
    std::ostream::flush();
    if (fromPoints.
        super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish !=
        fromPoints.
        super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>._M_impl
        .super__Vector_impl_data._M_start) {
      fromPoints.
      super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish =
           fromPoints.
           super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    lVar4 = local_c0;
    if (toPoints.
        super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish !=
        toPoints.
        super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>._M_impl
        .super__Vector_impl_data._M_start) {
      toPoints.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           toPoints.
           super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    while (lVar4 != 0) {
      dVar1 = (double)Imath_2_5::erand48(random._state);
      dVar2 = (double)Imath_2_5::erand48(random._state);
      fromPt.z = (double)Imath_2_5::erand48(random._state);
      fromPt.x = dVar1;
      fromPt.y = dVar2;
      Imath_2_5::operator*(&fromPt,m);
      local_d0.y = (float)fromPt.y;
      local_d0.x = (float)fromPt.x;
      local_d0.z = (float)fromPt.z;
      std::vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>>::
      emplace_back<Imath_2_5::Vec3<float>>
                ((vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>> *)
                 &fromPoints,&local_d0);
      local_d0.y = (float)toPt.y;
      local_d0.x = (float)toPt.x;
      local_d0.z = (float)toPt.z;
      std::vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>>::
      emplace_back<Imath_2_5::Vec3<float>>
                ((vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>> *)&toPoints,
                 &local_d0);
      lVar4 = lVar4 + -1;
    }
    verifyProcrustes<float>(&fromPoints,&toPoints);
    lVar4 = local_c0 + 1;
  }
  std::operator<<((ostream *)&std::cout,"OK\n");
  std::_Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>::~_Vector_base
            (&toPoints.
              super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>);
  std::_Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>::~_Vector_base
            (&fromPoints.
              super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>);
  return;
}

Assistant:

void
testProcrustesWithMatrix (const IMATH_INTERNAL_NAMESPACE::M44d& m)
{
    std::cout << "Testing Procrustes algorithm with arbitrary matrix: \n" << m;
    std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T> > fromPoints;
    std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T> > toPoints;

    IMATH_INTERNAL_NAMESPACE::Rand48 random (1209);
    std::cout << "   numPoints: ";
    for (size_t numPoints = 1; numPoints < 10; ++numPoints)
    {
        std::cout << numPoints << " " << std::flush;
        fromPoints.clear(); toPoints.clear();
        for (size_t i = 0; i < numPoints; ++i)
        {
            const IMATH_INTERNAL_NAMESPACE::V3d fromPt (random.nextf(), random.nextf(), random.nextf());
            const IMATH_INTERNAL_NAMESPACE::V3d toPt = fromPt * m;
            fromPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T>(fromPt));
            toPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T>(toPt));
        }
        verifyProcrustes (fromPoints, toPoints);
    }
    std::cout << "OK\n";
}